

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

void __thiscall
FastPForLib::FastPForTest_fastpack_3_except_64_Test::FastPForTest_fastpack_3_except_64_Test
          (FastPForTest_fastpack_3_except_64_Test *this)

{
  FastPForTest *in_RDI;
  
  FastPForTest::FastPForTest(in_RDI);
  (in_RDI->
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__FastPForTest_fastpack_3_except_64_Test_00340038;
  (in_RDI->
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__FastPForTest_fastpack_3_except_64_Test_00340078;
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_3_except_64) {
    _genDataWithFixBits64(in64, 3, 256);
    for (int i = 20; i < 40; ++i) {
      in64[i] = ~0UL - i;
    }
    for (int i = 155; i < 195; i += 2) {
      in64[i] = ~0UL - i ;
    }
    _verify64();
  }